

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_moveRegisterToOperand
               (sysbvm_bytecodeJit_t *jit,int16_t operand,sysbvm_x86_register_t reg)

{
  int32_t vectorOffset;
  int16_t vectorIndex;
  sysbvm_operandVectorName_t vectorType;
  sysbvm_x86_register_t reg_local;
  int16_t operand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (-1 < operand >> 2) {
    if ((operand & 3U) != 3) {
      abort();
    }
    sysbvm_jit_x86_mov64IntoMemoryWithOffset
              (jit,SYSBVM_X86_EBP,jit->localVectorOffset + (operand >> 2) * 8,reg);
  }
  return;
}

Assistant:

static void sysbvm_jit_moveRegisterToOperand(sysbvm_bytecodeJit_t *jit, int16_t operand, sysbvm_x86_register_t reg)
{
    sysbvm_operandVectorName_t vectorType = (sysbvm_operandVectorName_t) (operand & SYSBVM_OPERAND_VECTOR_BITMASK);
    int16_t vectorIndex = operand >> SYSBVM_OPERAND_VECTOR_BITS;
    if(vectorIndex < 0)
        return;

    int32_t vectorOffset = vectorIndex * sizeof(void*);
    switch(vectorType)
    {
    case SYSBVM_OPERAND_VECTOR_LOCAL:
        sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RBP, jit->localVectorOffset + vectorOffset, reg);
        break;
    default:
        abort();
        break;
    }
}